

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O1

Stream * rw::readMaterialMatFX(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int *piVar1;
  bool bVar2;
  uint32 uVar3;
  int32 iVar4;
  int32 iVar5;
  int32 iVar6;
  Texture *pTVar7;
  Texture *pTVar8;
  long lVar9;
  int *piVar10;
  int iVar11;
  float32 fVar12;
  
  uVar3 = Stream::readU32(stream);
  MatFX::setEffects((Material *)object,uVar3);
  piVar1 = *(int **)((long)object + (long)DAT_0014a1fc);
  iVar11 = 0;
  do {
    uVar3 = Stream::readU32(stream);
    if (uVar3 == 4) {
      iVar4 = Stream::readI32(stream);
      iVar5 = Stream::readI32(stream);
      iVar6 = Stream::readI32(stream);
      if (iVar6 == 0) {
        pTVar7 = (Texture *)0x0;
      }
      else {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          readMaterialMatFX();
          return (Stream *)0x0;
        }
        pTVar7 = Texture::streamRead(stream);
      }
      lVar9 = 0;
      piVar10 = piVar1;
      do {
        if (*piVar10 == 4) goto LAB_0012fd93;
        lVar9 = lVar9 + 1;
        piVar10 = piVar10 + 10;
      } while (lVar9 == 1);
      lVar9 = -1;
LAB_0012fd93:
      lVar9 = (long)(int)lVar9;
      *(Texture **)(piVar1 + lVar9 * 10 + 2) = pTVar7;
      piVar1[lVar9 * 10 + 4] = iVar4;
      piVar1[lVar9 * 10 + 5] = iVar5;
    }
    else if (uVar3 == 2) {
      fVar12 = Stream::readF32(stream);
      iVar4 = Stream::readI32(stream);
      iVar5 = Stream::readI32(stream);
      if (iVar5 == 0) {
        pTVar7 = (Texture *)0x0;
      }
      else {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          readMaterialMatFX();
          return (Stream *)0x0;
        }
        pTVar7 = Texture::streamRead(stream);
      }
      lVar9 = 0;
      piVar10 = piVar1;
      do {
        if (*piVar10 == 2) goto LAB_0012fd50;
        lVar9 = lVar9 + 1;
        piVar10 = piVar10 + 10;
      } while (lVar9 == 1);
      lVar9 = -1;
LAB_0012fd50:
      lVar9 = (long)(int)lVar9;
      *(Texture **)(piVar1 + lVar9 * 10 + 4) = pTVar7;
      piVar1[lVar9 * 10 + 7] = iVar4;
      piVar1[lVar9 * 10 + 6] = (int)fVar12;
    }
    else if (uVar3 == 1) {
      fVar12 = Stream::readF32(stream);
      iVar4 = Stream::readI32(stream);
      if (iVar4 == 0) {
        pTVar7 = (Texture *)0x0;
      }
      else {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          readMaterialMatFX();
          return (Stream *)0x0;
        }
        pTVar7 = Texture::streamRead(stream);
      }
      iVar4 = Stream::readI32(stream);
      if (iVar4 == 0) {
        pTVar8 = (Texture *)0x0;
      }
      else {
        bVar2 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar2) {
          readMaterialMatFX();
          return (Stream *)0x0;
        }
        pTVar8 = Texture::streamRead(stream);
      }
      lVar9 = 0;
      piVar10 = piVar1;
      do {
        if (*piVar10 == 1) goto LAB_0012fdf9;
        lVar9 = lVar9 + 1;
        piVar10 = piVar10 + 10;
      } while (lVar9 == 1);
      lVar9 = -1;
LAB_0012fdf9:
      lVar9 = (long)(int)lVar9;
      *(Texture **)(piVar1 + lVar9 * 10 + 4) = pTVar7;
      *(Texture **)(piVar1 + lVar9 * 10 + 6) = pTVar8;
      piVar1[lVar9 * 10 + 8] = (int)fVar12;
    }
    bVar2 = iVar11 != 0;
    iVar11 = iVar11 + 1;
    if (bVar2) {
      return stream;
    }
  } while( true );
}

Assistant:

static Stream*
readMaterialMatFX(Stream *stream, int32, void *object, int32 offset, int32)
{
	Material *mat;
	MatFX *matfx;
	Texture *tex, *bumpedTex;
	float coefficient;
	int32 fbAlpha;
	int32 srcBlend, dstBlend;
	int32 idx;

	mat = (Material*)object;
	MatFX::setEffects(mat, stream->readU32());
	matfx = MatFX::get(mat);

	for(int i = 0; i < 2; i++){
		uint32 type = stream->readU32();
		switch(type){
		case MatFX::BUMPMAP:
			coefficient = stream->readF32();
			bumpedTex = tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				bumpedTex = Texture::streamRead(stream);
			}
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].bump.bumpedTex = bumpedTex;
			matfx->fx[idx].bump.tex = tex;
			matfx->fx[idx].bump.coefficient = coefficient;
			break;

		case MatFX::ENVMAP:
			coefficient = stream->readF32();
			fbAlpha = stream->readI32();
			tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].env.tex = tex;
			matfx->fx[idx].env.fbAlpha = fbAlpha;
			matfx->fx[idx].env.coefficient = coefficient;
			break;

		case MatFX::DUAL:
			srcBlend = stream->readI32();
			dstBlend = stream->readI32();
			tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].dual.tex = tex;
			matfx->fx[idx].dual.srcBlend = srcBlend;
			matfx->fx[idx].dual.dstBlend = dstBlend;
			break;
		}
	}
	return stream;
}